

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlNodePtr xmlAddChild(xmlNodePtr parent,xmlNodePtr cur)

{
  int iVar1;
  xmlNodePtr local_28;
  xmlNodePtr prev;
  xmlNodePtr cur_local;
  xmlNodePtr parent_local;
  
  if ((((parent == (xmlNodePtr)0x0) || (parent->type == XML_NAMESPACE_DECL)) ||
      (cur == (xmlNodePtr)0x0)) || ((cur->type == XML_NAMESPACE_DECL || (parent == cur)))) {
    parent_local = (xmlNodePtr)0x0;
  }
  else if (parent->type == XML_TEXT_NODE) {
    iVar1 = xmlTextAddContent(parent,cur->content,-1);
    if (iVar1 < 0) {
      parent_local = (xmlNodePtr)0x0;
    }
    else {
      xmlFreeNode(cur);
      parent_local = parent;
    }
  }
  else {
    if (cur->type == XML_ATTRIBUTE_NODE) {
      local_28 = (xmlNodePtr)parent->properties;
      if (local_28 != (xmlNodePtr)0x0) {
        for (; local_28->next != (_xmlNode *)0x0; local_28 = local_28->next) {
        }
      }
    }
    else {
      local_28 = parent->last;
    }
    parent_local = cur;
    if (cur != local_28) {
      parent_local = xmlInsertNode(parent->doc,cur,parent,local_28,(xmlNodePtr)0x0,1);
    }
  }
  return parent_local;
}

Assistant:

xmlNodePtr
xmlAddChild(xmlNodePtr parent, xmlNodePtr cur) {
    xmlNodePtr prev;

    if ((parent == NULL) || (parent->type == XML_NAMESPACE_DECL) ||
        (cur == NULL) || (cur->type == XML_NAMESPACE_DECL) ||
        (parent == cur))
        return(NULL);

    /*
     * If parent is a text node, call xmlTextAddContent. This
     * undocumented quirk should probably be removed.
     */
    if (parent->type == XML_TEXT_NODE) {
        if (xmlTextAddContent(parent, cur->content, -1) < 0)
            return(NULL);
        xmlFreeNode(cur);
        return(parent);
    }

    if (cur->type == XML_ATTRIBUTE_NODE) {
        prev = (xmlNodePtr) parent->properties;
        if (prev != NULL) {
            while (prev->next != NULL)
                prev = prev->next;
        }
    } else {
        prev = parent->last;
    }

    if (cur == prev)
        return(cur);

    return(xmlInsertNode(parent->doc, cur, parent, prev, NULL, 1));
}